

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vision.c
# Opt level: O2

void vision_recalc(int control)

{
  uint x;
  byte bVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  level *plVar5;
  char **ppcVar6;
  char cVar7;
  boolean bVar8;
  xchar xVar9;
  char cVar10;
  byte bVar11;
  int iVar12;
  char **loc_cs_rows;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  uchar *puVar17;
  uint uVar18;
  long lVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  char *left_most;
  ulong uVar23;
  char *right_most;
  uint uVar24;
  long lVar25;
  char *pcVar26;
  bool bVar27;
  long local_58;
  long local_40;
  
  vision_full_recalc = '\0';
  if (in_mklev != '\0') {
    vision_full_recalc = '\0';
    return;
  }
  if (iflags.vision_inited == '\0') {
    vision_full_recalc = '\0';
    return;
  }
  bVar27 = viz_array != cs_rows0;
  loc_cs_rows = cs_rows1;
  if (bVar27) {
    loc_cs_rows = cs_rows0;
  }
  left_most = cs_rmin0;
  if (!bVar27) {
    left_most = cs_rmin1;
  }
  right_most = cs_rmax0;
  if (!bVar27) {
    right_most = cs_rmax1;
  }
  memset(*loc_cs_rows,0,0x690);
  for (lVar16 = 0; (int)lVar16 != 0x15; lVar16 = lVar16 + 1) {
    left_most[lVar16] = 'O';
    right_most[lVar16] = '\0';
  }
  if ((control != 2) && ((u._1052_1_ & 1) == 0)) {
    if (u.uprops[0x1e].intrinsic != 0) {
LAB_0026c7e2:
      if (ublindf != (obj *)0x0) {
LAB_0026c7e7:
        if (ublindf->oartifact == '\x1d') goto LAB_0026c8c6;
      }
      view_from((int)u.uy,(int)u.ux,loc_cs_rows,left_most,right_most,0,
                (_func_void_int_int_void_ptr *)0x0,(void *)0x0);
      ppcVar6 = viz_array;
      viz_array = loc_cs_rows;
      for (lVar16 = 0; lVar16 != 0x15; lVar16 = lVar16 + 1) {
        pcVar2 = ppcVar6[lVar16];
        cVar10 = right_most[lVar16];
        if (right_most[lVar16] < viz_rmax[lVar16]) {
          cVar10 = viz_rmax[lVar16];
        }
        cVar7 = viz_rmin[lVar16];
        if (left_most[lVar16] < viz_rmin[lVar16]) {
          cVar7 = left_most[lVar16];
        }
        for (lVar25 = (long)cVar7; lVar25 <= cVar10; lVar25 = lVar25 + 1) {
          if ((pcVar2[lVar25] & 2U) != 0) {
            newsym((int)lVar25,(int)lVar16);
          }
        }
      }
      goto LAB_0026d27d;
    }
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0026c7e7;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0026c7e2;
LAB_0026c8c6:
    bVar8 = on_level(&u.uz,&dungeon_topology.d_rogue_level);
    if (bVar8 == '\0') {
      if (((u._1052_1_ & 2) == 0) ||
         (bVar8 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar8 != '\0')) {
        if ((u.utrap == 0) || (u.utraptype != 1)) {
          bVar27 = false;
          view_from((int)u.uy,(int)u.ux,loc_cs_rows,left_most,right_most,0,
                    (_func_void_int_int_void_ptr *)0x0,(void *)0x0);
        }
        else {
          xVar9 = u.uy;
          for (uVar20 = (int)u.uy - 1; (int)uVar20 <= xVar9 + 1; uVar20 = uVar20 + 1) {
            if (-1 < (int)uVar20) {
              if (0x14 < uVar20) break;
              cVar10 = u.ux;
              cVar7 = '\x01';
              if ('\x01' < cVar10) {
                cVar7 = cVar10;
              }
              left_most[uVar20] = cVar7 - 1U;
              if ('M' < cVar10) {
                cVar10 = 'N';
              }
              cVar10 = cVar10 + '\x01';
              right_most[uVar20] = cVar10;
              pcVar2 = loc_cs_rows[uVar20];
              for (uVar22 = (ulong)(byte)(cVar7 - 1U); (long)uVar22 <= (long)cVar10;
                  uVar22 = uVar22 + 1) {
                pcVar2[uVar22] = '\x03';
                cVar10 = right_most[uVar20];
              }
              xVar9 = u.uy;
            }
          }
          bVar27 = false;
        }
      }
      else {
        uVar20 = (uint)u.uy;
        for (uVar18 = uVar20 - 1; (int)uVar18 <= (char)uVar20 + 1; uVar18 = uVar18 + 1) {
          uVar15 = (uint)u.ux;
          uVar24 = uVar15 - 1;
          uVar20 = uVar15 - 2;
          while (x = uVar20 + 1, (int)x <= (char)uVar15 + 1) {
            cVar10 = (char)uVar24;
            if ((uVar20 < 0x4f && uVar18 < 0x15) && (bVar8 = is_pool(level,x,uVar18), bVar8 != '\0')
               ) {
              cVar7 = left_most[uVar18];
              if ((int)x <= (int)left_most[uVar18]) {
                cVar7 = cVar10;
              }
              left_most[uVar18] = cVar7;
              cVar7 = cVar10;
              if ((int)x < (int)right_most[uVar18]) {
                cVar7 = right_most[uVar18];
              }
              right_most[uVar18] = cVar7;
              loc_cs_rows[uVar18][x] = '\x03';
            }
            uVar24 = (uint)(byte)(cVar10 + 1);
            uVar20 = x;
            uVar15 = u._0_4_ & 0xff;
          }
          uVar20 = (uint)u._0_4_ >> 8 & 0xff;
        }
        bVar27 = true;
      }
      uVar22 = (ulong)u.xray_range;
      if (-1 < (long)uVar22) {
        if (u.xray_range == 0) {
          loc_cs_rows[u.uy][u.ux] = loc_cs_rows[u.uy][u.ux] | 2;
          xVar9 = u.ux;
          lVar16 = (long)u.uy;
          level->locations[u.ux][lVar16].seenv = 0xff;
          cVar10 = left_most[lVar16];
          if (xVar9 < left_most[lVar16]) {
            cVar10 = xVar9;
          }
          left_most[lVar16] = cVar10;
          cVar10 = right_most[lVar16];
          if (right_most[lVar16] < xVar9) {
            cVar10 = xVar9;
          }
          right_most[lVar16] = cVar10;
        }
        else {
          cVar10 = ""[uVar22];
          uVar20 = (uint)u.uy;
          for (uVar18 = uVar20 - u.xray_range; (int)uVar18 <= (int)uVar22 + (int)(char)uVar20;
              uVar18 = uVar18 + 1) {
            if (-1 < (int)uVar18) {
              if (0x14 < uVar18) break;
              uVar22 = (ulong)uVar18;
              uVar15 = (int)(char)uVar20 - uVar18;
              uVar20 = -uVar15;
              if (0 < (int)uVar15) {
                uVar20 = uVar15;
              }
              pcVar2 = loc_cs_rows[uVar22];
              uVar15 = (int)u.ux -
                       (int)"\x01\x01\x02\x02\x01\x03\x03\x02\x01\x04\x04\x04\x03\x02\x05\x05\x05\x04\x03\x02\x06\x06\x06\x05\x05\x04\x02\a\a\a\x06\x06\x05\x04\x02\b\b\b\a\a\x06\x06\x04\x02\t\t\t\t\b\b\a\x06\x05\x03\n\n\n\n\t\t\b\a\x06\x05\x03\v\v\v\v\n\n\t\t\b\a\x05\x03\f\f\f\f\v\v\n\n\t\b\a\x05\x03\r\r\r\r\f\f\f\v\n\n\t\a\x06\x03\x0e\x0e\x0e\x0e\r\r\r\f\f\v\n\t\b\x06\x03\x0f\x0f\x0f\x0f\x0e\x0e\x0e\r\r\f\v\n\t\b\x06\x03\x10"
                            [(ulong)uVar20 + (long)cVar10];
              if ((int)uVar15 < 1) {
                uVar15 = 0;
              }
              uVar14 = (ulong)uVar15;
              iVar12 = (int)"\x01\x01\x02\x02\x01\x03\x03\x02\x01\x04\x04\x04\x03\x02\x05\x05\x05\x04\x03\x02\x06\x06\x06\x05\x05\x04\x02\a\a\a\x06\x06\x05\x04\x02\b\b\b\a\a\x06\x06\x04\x02\t\t\t\t\b\b\a\x06\x05\x03\n\n\n\n\t\t\b\a\x06\x05\x03\v\v\v\v\n\n\t\t\b\a\x05\x03\f\f\f\f\v\v\n\n\t\b\a\x05\x03\r\r\r\r\f\f\f\v\n\n\t\a\x06\x03\x0e\x0e\x0e\x0e\r\r\r\f\f\v\n\t\b\x06\x03\x0f\x0f\x0f\x0f\x0e\x0e\x0e\r\r\f\v\n\t\b\x06\x03\x10"
                            [(ulong)uVar20 + (long)cVar10] + (int)u.ux;
              if (0x4e < iVar12) {
                iVar12 = 0x4f;
              }
              lVar16 = uVar14 * 0xfc + uVar22 * 0xc + 0x45;
              for (; (long)uVar14 <= (long)iVar12; uVar14 = uVar14 + 1) {
                bVar1 = pcVar2[uVar14];
                pcVar2[uVar14] = bVar1 | 2;
                cVar7 = level->levname[lVar16];
                level->levname[lVar16] = -1;
                if (((bVar1 & 2) == 0) || (cVar7 != -1)) {
                  newsym((int)uVar14,uVar18);
                }
                lVar16 = lVar16 + 0xfc;
              }
              cVar7 = left_most[uVar22];
              if ((int)uVar15 < (int)cVar7) {
                cVar7 = (char)uVar15;
              }
              iVar4 = (int)right_most[uVar22];
              if (right_most[uVar22] < iVar12) {
                iVar4 = iVar12;
              }
              left_most[uVar22] = cVar7;
              right_most[uVar22] = (char)iVar4;
              uVar20 = (uint)u._0_4_ >> 8 & 0xff;
              uVar22 = (ulong)(uint)u.xray_range;
            }
          }
        }
      }
      if ((!bVar27) && (uVar22 = (ulong)(uint)u.nv_range, u.xray_range < u.nv_range)) {
        if (u.nv_range == 0) {
          loc_cs_rows[u.uy][u.ux] = loc_cs_rows[u.uy][u.ux] | 2;
          xVar9 = u.ux;
          lVar16 = (long)u.uy;
          level->locations[u.ux][lVar16].seenv = 0xff;
          cVar10 = left_most[lVar16];
          if (xVar9 < left_most[lVar16]) {
            cVar10 = xVar9;
          }
          left_most[lVar16] = cVar10;
          cVar10 = right_most[lVar16];
          if (right_most[lVar16] < xVar9) {
            cVar10 = xVar9;
          }
          right_most[lVar16] = cVar10;
        }
        else if (0 < u.nv_range) {
          cVar10 = ""[uVar22];
          uVar18 = (uint)u.uy;
          for (uVar20 = uVar18 - u.nv_range; (int)uVar20 <= (int)uVar22 + (int)(char)uVar18;
              uVar20 = uVar20 + 1) {
            if (-1 < (int)uVar20) {
              if (0x14 < uVar20) break;
              uVar15 = (int)(char)uVar18 - uVar20;
              uVar18 = -uVar15;
              if (0 < (int)uVar15) {
                uVar18 = uVar15;
              }
              pcVar2 = loc_cs_rows[uVar20];
              uVar15 = (int)u.ux -
                       (int)"\x01\x01\x02\x02\x01\x03\x03\x02\x01\x04\x04\x04\x03\x02\x05\x05\x05\x04\x03\x02\x06\x06\x06\x05\x05\x04\x02\a\a\a\x06\x06\x05\x04\x02\b\b\b\a\a\x06\x06\x04\x02\t\t\t\t\b\b\a\x06\x05\x03\n\n\n\n\t\t\b\a\x06\x05\x03\v\v\v\v\n\n\t\t\b\a\x05\x03\f\f\f\f\v\v\n\n\t\b\a\x05\x03\r\r\r\r\f\f\f\v\n\n\t\a\x06\x03\x0e\x0e\x0e\x0e\r\r\r\f\f\v\n\t\b\x06\x03\x0f\x0f\x0f\x0f\x0e\x0e\x0e\r\r\f\v\n\t\b\x06\x03\x10"
                            [(ulong)uVar18 + (long)cVar10];
              if ((int)uVar15 < 1) {
                uVar15 = 0;
              }
              uVar22 = (ulong)uVar15;
              iVar12 = (int)"\x01\x01\x02\x02\x01\x03\x03\x02\x01\x04\x04\x04\x03\x02\x05\x05\x05\x04\x03\x02\x06\x06\x06\x05\x05\x04\x02\a\a\a\x06\x06\x05\x04\x02\b\b\b\a\a\x06\x06\x04\x02\t\t\t\t\b\b\a\x06\x05\x03\n\n\n\n\t\t\b\a\x06\x05\x03\v\v\v\v\n\n\t\t\b\a\x05\x03\f\f\f\f\v\v\n\n\t\b\a\x05\x03\r\r\r\r\f\f\f\v\n\n\t\a\x06\x03\x0e\x0e\x0e\x0e\r\r\r\f\f\v\n\t\b\x06\x03\x0f\x0f\x0f\x0f\x0e\x0e\x0e\r\r\f\v\n\t\b\x06\x03\x10"
                            [(ulong)uVar18 + (long)cVar10] + (int)u.ux;
              if (0x4e < iVar12) {
                iVar12 = 0x4f;
              }
              for (; (long)uVar22 <= (long)iVar12; uVar22 = uVar22 + 1) {
                bVar1 = pcVar2[uVar22];
                if (bVar1 != 0) {
                  pcVar2[uVar22] = bVar1 | 2;
                }
              }
              uVar18 = (int)left_most[uVar20];
              if ((int)uVar15 < (int)left_most[uVar20]) {
                uVar18 = uVar15;
              }
              iVar4 = (int)right_most[uVar20];
              if (right_most[uVar20] < iVar12) {
                iVar4 = iVar12;
              }
              left_most[uVar20] = (char)uVar18;
              right_most[uVar20] = (char)iVar4;
              uVar18 = (uint)u._0_4_ >> 8 & 0xff;
              uVar22 = (ulong)(uint)u.nv_range;
            }
          }
        }
      }
    }
    else {
      lVar16 = (long)u.ux;
      lVar25 = (long)u.uy;
      uVar20 = *(ushort *)&level->locations[lVar16][lVar25].field_0x8 & 0x3f;
      if (2 < uVar20) {
        uVar20 = uVar20 - 3;
        lVar16 = (long)level->rooms[uVar20].ly;
        lVar25 = lVar16 * 0xc + -0xc3;
        for (lVar16 = lVar16 + -1; plVar5 = level, lVar16 <= (long)level->rooms[uVar20].hy + 1;
            lVar16 = lVar16 + 1) {
          cVar10 = level->rooms[uVar20].lx;
          left_most[lVar16] = cVar10 + -1;
          lVar13 = (long)plVar5->rooms[uVar20].hx + 1;
          right_most[lVar16] = (char)lVar13;
          lVar21 = (long)cVar10 * 0xfc + lVar25;
          for (lVar19 = (long)cVar10 + -1; lVar19 <= lVar13; lVar19 = lVar19 + 1) {
            if (level->rooms[uVar20].rlit == '\0') {
              loc_cs_rows[lVar16][lVar19] = '\x01';
            }
            else {
              loc_cs_rows[lVar16][lVar19] = '\x03';
              level->levname[lVar21] = -1;
            }
            lVar21 = lVar21 + 0xfc;
          }
          lVar25 = lVar25 + 0xc;
        }
        lVar16 = (long)u.ux;
        lVar25 = (long)u.uy;
      }
      uVar20 = (uint)u.uy;
      uVar22 = 1;
      if (1 < (int)uVar20) {
        uVar22 = (ulong)uVar20;
      }
      uVar18 = 0x13;
      if ((int)uVar20 < 0x13) {
        uVar18 = uVar20;
      }
      cVar10 = level->locations[lVar16][lVar25].typ;
      uVar20 = (uint)u.ux;
      uVar14 = 2;
      if (2 < (int)uVar20) {
        uVar14 = (ulong)uVar20;
      }
      uVar15 = 0x4e;
      if ((int)uVar20 < 0x4e) {
        uVar15 = uVar20;
      }
      for (uVar22 = uVar22 - 1; (long)uVar22 <= (long)(int)(uVar18 + 1); uVar22 = uVar22 + 1) {
        if ((int)uVar14 <= (int)left_most[uVar22]) {
          left_most[uVar22] = (char)uVar14 + -1;
        }
        uVar23 = uVar14 - 1;
        if ((int)right_most[uVar22] <= (int)uVar15) {
          right_most[uVar22] = (char)(uVar15 + 1);
        }
        for (; (long)uVar23 <= (long)(int)(uVar15 + 1); uVar23 = uVar23 + 1) {
          loc_cs_rows[uVar22][uVar23] = '\x03';
          if ((cVar10 == '\x17') && ((uVar23 == (uint)(int)u.ux || (uVar22 == (uint)(int)u.uy)))) {
            newsym((int)uVar23,(int)uVar22);
          }
        }
      }
    }
  }
  do_light_sources(loc_cs_rows);
  ppcVar6 = viz_array;
  lVar16 = (long)u.ux;
  viz_array = loc_cs_rows;
  (vision_recalc::colbump + lVar16)[0] = '\x01';
  (vision_recalc::colbump + lVar16)[1] = '\x01';
  local_58 = 0x46;
  local_40 = 0;
  for (uVar22 = 0; uVar22 != 0x15; uVar22 = uVar22 + 1) {
    cVar10 = left_most[uVar22];
    if (viz_rmin[uVar22] < left_most[uVar22]) {
      cVar10 = viz_rmin[uVar22];
    }
    lVar16 = 0;
    if (u.ux <= cVar10) {
      lVar16 = (ulong)(u.ux < cVar10) + 1;
    }
    uVar20 = (uint)(uVar22 != (uint)(int)u.uy);
    pcVar2 = loc_cs_rows[uVar22];
    if ((long)u.uy < (long)uVar22) {
      uVar20 = 0xffffffff;
    }
    cVar7 = right_most[uVar22];
    if (right_most[uVar22] < viz_rmax[uVar22]) {
      cVar7 = viz_rmax[uVar22];
    }
    pcVar3 = ppcVar6[uVar22];
    lVar25 = (long)cVar10;
    puVar17 = seenv_matrix[uVar20 + 1] + lVar16;
    iVar12 = uVar20 + (int)uVar22;
    lVar16 = lVar25 * 0xfc;
    pcVar26 = level->levname + local_58;
    for (; lVar25 <= cVar7; lVar25 = lVar25 + 1) {
      bVar1 = pcVar2[lVar25];
      if ((bVar1 & 2) == 0) {
        if (((bVar1 & 1) != 0) && ((bVar1 & 4) != 0 || (*(uint *)(pcVar26 + lVar16) & 0x400) != 0))
        {
          cVar10 = pcVar26[lVar16 + -2];
          if ((cVar10 != '\0') &&
             ((((cVar10 == '\x0f' || (cVar10 == '\x17')) || (cVar10 < '\r')) &&
              (viz_clear[0][local_40 + lVar25] == '\0')))) {
            uVar14 = (ulong)(lVar25 != u.ux);
            if (u.ux < lVar25) {
              uVar14 = 0xffffffffffffffff;
            }
            if (((level->locations[uVar14 + lVar25][iVar12].field_0x7 & 4) == 0) &&
               ((loc_cs_rows[iVar12][lVar25 + uVar14] & 4U) == 0)) goto LAB_0026d1f9;
          }
          pcVar2[lVar25] = bVar1 | 2;
          goto LAB_0026d1cb;
        }
        if (((bVar1 & 1) != 0) && ((*(uint *)(pcVar26 + lVar16) >> 0xb & 1) != 0)) {
          *(uint *)(pcVar26 + lVar16) = *(uint *)(pcVar26 + lVar16) & 0xfffff7ff;
          goto LAB_0026d21e;
        }
LAB_0026d1f9:
        bVar11 = pcVar3[lVar25];
        if (((bVar11 & 2) != 0) || ((bVar11 & 1) != (bVar1 & 1))) goto LAB_0026d21e;
      }
      else {
LAB_0026d1cb:
        bVar1 = pcVar26[lVar16 + -1];
        bVar11 = *puVar17 | bVar1;
        pcVar26[lVar16 + -1] = bVar11;
        if (((pcVar3[lVar25] & 2U) == 0) || (bVar1 != bVar11)) {
LAB_0026d21e:
          newsym((int)lVar25,(int)uVar22);
        }
      }
      puVar17 = puVar17 + vision_recalc::colbump[lVar25 + 1];
      pcVar26 = pcVar26 + 0xfc;
    }
    local_40 = local_40 + 0x50;
    local_58 = local_58 + 0xc;
  }
  lVar16 = (long)u.ux;
  (vision_recalc::colbump + lVar16)[0] = '\0';
  (vision_recalc::colbump + lVar16)[1] = '\0';
LAB_0026d27d:
  if (program_state.panicking == 0) {
    newsym((int)u.ux,(int)u.uy);
  }
  viz_rmin = left_most;
  viz_rmax = right_most;
  return;
}

Assistant:

void vision_recalc(int control)
{
    char **temp_array;	/* points to the old vision array */
    char **next_array;	/* points to the new vision array */
    char *next_row;	/* row pointer for the new array */
    char *old_row;	/* row pointer for the old array */
    char *next_rmin;	/* min pointer for the new array */
    char *next_rmax;	/* max pointer for the new array */
    const char *ranges;	/* circle ranges -- used for xray & night vision */
    int row;		/* row counter (outer loop)  */
    int start, stop;	/* inner loop starting/stopping index */
    int dx, dy;		/* one step from a lit door or lit wall (see below) */
    int col;	/* inner loop counter */
    struct rm *loc;	/* pointer to current pos */
    struct rm *flev;	/* pointer to position in "front" of current pos */
    extern unsigned char seenv_matrix[3][3];	/* from display.c */
    static unsigned char colbump[COLNO+1];	/* cols to bump sv */
    unsigned char *sv;				/* ptr to seen angle bits */
    int oldseenv;				/* previous seenv value */

    vision_full_recalc = 0;			/* reset flag */
    if (in_mklev || !iflags.vision_inited) return;

    /*
     * Either the light sources have been taken care of, or we must
     * recalculate them here.
     */

    /* Get the unused could see, row min, and row max arrays. */
    get_unused_cs(&next_array, &next_rmin, &next_rmax);

    /* You see nothing, nothing can see you --- if swallowed or refreshing. */
    if (u.uswallow || control == 2) {
	/* do nothing -- get_unused_cs() nulls out the new work area */

    } else if (Blind) {
	/*
	 * Calculate the could_see array even when blind so that monsters
	 * can see you, even if you can't see them.  Note that the current
	 * setup allows:
	 *
	 *	+ Monsters to see with the "new" vision, even on the rogue
	 *	  level.
	 *
	 *	+ Monsters can see you even when you're in a pit.
	 */
	view_from(u.uy, u.ux, next_array, next_rmin, next_rmax,
		0, (void (*)(int,int,void *))0, 0);

	/*
	 * Our own version of the update loop below.  We know we can't see
	 * anything, so we only need update positions we used to be able
	 * to see.
	 */
	temp_array = viz_array;	/* set viz_array so newsym() will work */
	viz_array = next_array;

	for (row = 0; row < ROWNO; row++) {
	    old_row = temp_array[row];

	    /* Find the min and max positions on the row. */
	    start = min(viz_rmin[row], next_rmin[row]);
	    stop  = max(viz_rmax[row], next_rmax[row]);

	    for (col = start; col <= stop; col++)
		if (old_row[col] & IN_SIGHT) newsym(col,row);
	}

	/* skip the normal update loop */
	goto skip;
    }
    else if (Is_rogue_level(&u.uz)) {
	rogue_vision(next_array,next_rmin,next_rmax);
    }
    else {
	int has_night_vision = 1;	/* hero has night vision */

	if (Underwater && !Is_waterlevel(&u.uz)) {
	    /*
	     * The hero is under water.  Only see surrounding locations if
	     * they are also underwater.  This overrides night vision but
	     * does not override x-ray vision.
	     */
	    has_night_vision = 0;

	    for (row = u.uy-1; row <= u.uy+1; row++)
		for (col = u.ux-1; col <= u.ux+1; col++) {
		    if (!isok(col,row) || !is_pool(level, col,row)) continue;

		    next_rmin[row] = min(next_rmin[row], col);
		    next_rmax[row] = max(next_rmax[row], col);
		    next_array[row][col] = IN_SIGHT | COULD_SEE;
		}
	}

	/* if in a pit, just update for immediate locations */
	else if (u.utrap && u.utraptype == TT_PIT) {
	    for (row = u.uy-1; row <= u.uy+1; row++) {
		if (row < 0) continue;	if (row >= ROWNO) break;

		next_rmin[row] = max(      0, u.ux - 1);
		next_rmax[row] = min(COLNO-1, u.ux + 1);
		next_row = next_array[row];

		for (col=next_rmin[row]; col <= next_rmax[row]; col++)
		    next_row[col] = IN_SIGHT | COULD_SEE;
	    }
	} else
	    view_from(u.uy, u.ux, next_array, next_rmin, next_rmax,
		0, (void (*)(int,int,void *))0, 0);

	/*
	 * Set the IN_SIGHT bit for xray and night vision.
	 */
	if (u.xray_range >= 0) {
	    if (u.xray_range) {
		ranges = circle_ptr(u.xray_range);

		for (row = u.uy-u.xray_range; row <= u.uy+u.xray_range; row++) {
		    if (row < 0) continue;	if (row >= ROWNO) break;
		    dy = v_abs(u.uy-row);	next_row = next_array[row];

		    start = max(      0, u.ux - ranges[dy]);
		    stop  = min(COLNO-1, u.ux + ranges[dy]);

		    for (col = start; col <= stop; col++) {
			char old_row_val = next_row[col];
			next_row[col] |= IN_SIGHT;
			oldseenv = level->locations[col][row].seenv;
			level->locations[col][row].seenv = SVALL;	/* see all! */
			/* Update if previously not in sight or new angle. */
			if (!(old_row_val & IN_SIGHT) || oldseenv != SVALL)
			    newsym(col,row);
		    }

		    next_rmin[row] = min(start, next_rmin[row]);
		    next_rmax[row] = max(stop, next_rmax[row]);
		}

	    } else {	/* range is 0 */
		next_array[u.uy][u.ux] |= IN_SIGHT;
		level->locations[u.ux][u.uy].seenv = SVALL;
		next_rmin[u.uy] = min(u.ux, next_rmin[u.uy]);
		next_rmax[u.uy] = max(u.ux, next_rmax[u.uy]);
	    }
	}

	if (has_night_vision && u.xray_range < u.nv_range) {
	    if (!u.nv_range) {	/* range is 0 */
		next_array[u.uy][u.ux] |= IN_SIGHT;
		level->locations[u.ux][u.uy].seenv = SVALL;
		next_rmin[u.uy] = min(u.ux, next_rmin[u.uy]);
		next_rmax[u.uy] = max(u.ux, next_rmax[u.uy]);
	    } else if (u.nv_range > 0) {
		ranges = circle_ptr(u.nv_range);

		for (row = u.uy-u.nv_range; row <= u.uy+u.nv_range; row++) {
		    if (row < 0) continue;	if (row >= ROWNO) break;
		    dy = v_abs(u.uy-row);	next_row = next_array[row];

		    start = max(      0, u.ux - ranges[dy]);
		    stop  = min(COLNO-1, u.ux + ranges[dy]);

		    for (col = start; col <= stop; col++)
			if (next_row[col]) next_row[col] |= IN_SIGHT;

		    next_rmin[row] = min(start, next_rmin[row]);
		    next_rmax[row] = max(stop, next_rmax[row]);
		}
	    }
	}
    }

    /* Set the correct bits for all light sources. */
    do_light_sources(next_array);


    /*
     * Make the viz_array the new array so that cansee() will work correctly.
     */
    temp_array = viz_array;
    viz_array = next_array;

    /*
     * The main update loop.  Here we do two things:
     *
     *	    + Set the IN_SIGHT bit for places that we could see and are lit.
     *	    + Reset changed places.
     *
     * There is one thing that make deciding what the hero can see
     * difficult:
     *
     *  1.  Directional lighting.  Items that block light create problems.
     *      The worst offenders are doors.  Suppose a door to a lit room
     *      is closed.  It is lit on one side, but not on the other.  How
     *      do you know?  You have to check the closest adjacent position.
     *	    Even so, that is not entirely correct.  But it seems close
     *	    enough for now.
     */
    colbump[u.ux] = colbump[u.ux+1] = 1;
    for (row = 0; row < ROWNO; row++) {
	dy = u.uy - row;                dy = sign(dy);
	next_row = next_array[row];     old_row = temp_array[row];

	/* Find the min and max positions on the row. */
	start = min(viz_rmin[row], next_rmin[row]);
	stop  = max(viz_rmax[row], next_rmax[row]);
	loc = &level->locations[start][row];

	sv = &seenv_matrix[dy+1][start < u.ux ? 0 : (start > u.ux ? 2:1)];

	for (col = start; col <= stop;
				loc += ROWNO, sv += (int) colbump[++col]) {
	    if (next_row[col] & IN_SIGHT) {
		/*
		 * We see this position because of night- or xray-vision.
		 */
		oldseenv = loc->seenv;
		loc->seenv |= new_angle(loc,sv,row,col); /* update seen angle */

		/* Update pos if previously not in sight or new angle. */
		if ( !(old_row[col] & IN_SIGHT) || oldseenv != loc->seenv)
		    newsym(col,row);
	    }

	    else if ((next_row[col] & COULD_SEE)
				&& (loc->lit || (next_row[col] & TEMP_LIT))) {
		/*
		 * We see this position because it is lit.
		 */
		if ((IS_DOOR(loc->typ) || loc->typ == SDOOR ||
		     IS_WALL(loc->typ)) && !viz_clear[row][col]) {
		    /*
		     * Make sure doors, walls, boulders or mimics don't show up
		     * at the end of dark hallways.  We do this by checking
		     * the adjacent position.  If it is lit, then we can see
		     * the door or wall, otherwise we can't.
		     */
		    dx = u.ux - col;	dx = sign(dx);
		    flev = &(level->locations[col+dx][row+dy]);
		    if (flev->lit || next_array[row+dy][col+dx] & TEMP_LIT) {
			next_row[col] |= IN_SIGHT;	/* we see it */

			oldseenv = loc->seenv;
			loc->seenv |= new_angle(loc,sv,row,col);

			/* Update pos if previously not in sight or new angle.*/
			if (!(old_row[col] & IN_SIGHT) || oldseenv!=loc->seenv)
			    newsym(col,row);
		    } else
			goto not_in_sight;	/* we don't see it */

		} else {
		    next_row[col] |= IN_SIGHT;	/* we see it */

		    oldseenv = loc->seenv;
		    loc->seenv |= new_angle(loc,sv,row,col);

		    /* Update pos if previously not in sight or new angle. */
		    if ( !(old_row[col] & IN_SIGHT) || oldseenv != loc->seenv)
			newsym(col,row);
		}
	    } else if ((next_row[col] & COULD_SEE) && loc->waslit) {
		/*
		 * If we make it here, the hero _could see_ the location,
		 * but doesn't see it (location is not lit).
		 * However, the hero _remembers_ it as lit (waslit is true).
		 * The hero can now see that it is not lit, so change waslit
		 * and update the location.
		 */
		loc->waslit = 0; /* remember lit condition */
		newsym(col,row);
	    }
	    /*
	     * At this point we know that the row position is *not* in normal
	     * sight.  That is, the position is could be seen, but is dark
	     * or LOS is just plain blocked.
	     *
	     * Update the position if:
	     * o If the old one *was* in sight.  We may need to clean up
	     *   the glyph -- E.g. darken room spot, etc.
	     * o If we now could see the location (yet the location is not
	     *   lit), but previously we couldn't see the location, or vice
	     *   versa.  Update the spot because there there may be an infared
	     *   monster there.
	     */
	    else {
not_in_sight:
		if ((old_row[col] & IN_SIGHT)
			|| ((next_row[col] & COULD_SEE)
				^ (old_row[col] & COULD_SEE)))
		    newsym(col,row);
	    }

	} /* end for col . . */
    }	/* end for row . .  */
    colbump[u.ux] = colbump[u.ux+1] = 0;

skip:
    /* This newsym() caused a crash delivering msg about failure to open
     * dungeon file init_dungeons() -> panic() -> done(11) ->
     * vision_recalc(2) -> newsym() -> crash!  u.ux and u.uy are 0 and
     * program_state.panicking == 1 under those circumstances
     */
    if (!program_state.panicking)
	newsym(u.ux, u.uy);		/* Make sure the hero shows up! */

    /* Set the new min and max pointers. */
    viz_rmin  = next_rmin;
    viz_rmax = next_rmax;
}